

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O0

Nodes * __thiscall
crawler::Node::getElementsByTag(Nodes *__return_storage_ptr__,Node *this,string *tagName)

{
  string *tagName_local;
  Node *this_local;
  
  getElementsByPredicate<crawler::Node::getElementsByTag(std::__cxx11::string_const&)::__0>
            (__return_storage_ptr__,this,(anon_class_8_1_27038425)tagName);
  return __return_storage_ptr__;
}

Assistant:

crawler::Nodes crawler::Node::getElementsByTag(const std::string &tagName) {
  return getElementsByPredicate([&tagName](const Node &node) -> bool {
    return node.getElementData().getTagName() == tagName;
  });
}